

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O1

void sysbvm_tuple_slotAtPut
               (sysbvm_context_t *context,sysbvm_tuple_t tuple,size_t slotIndex,sysbvm_tuple_t value
               )

{
  ulong uVar1;
  undefined1 uVar2;
  bool bVar3;
  bool bVar4;
  
  bVar3 = tuple == 0;
  bVar4 = (tuple & 0xf) != 0;
  if (bVar4 || bVar3) {
    sysbvm_error_modifyImmediateValue();
  }
  else if ((*(byte *)(tuple + 8) & 0x80) != 0) {
    sysbvm_error_accessDummyValue();
  }
  if ((tuple & 0xf) != 0) {
    sysbvm_error_modifyImmutableTuple();
  }
  if (bVar4 || bVar3) {
LAB_00143c3b:
    uVar1 = 0;
  }
  else {
    if ((*(uint *)(tuple + 8) & 0x300) == 0x200) {
      if (bVar4 || bVar3) {
        uVar1 = 0;
      }
      else {
        uVar1 = (ulong)*(uint *)(tuple + 0xc);
      }
      if (slotIndex < uVar1) {
        uVar2 = 0;
        if ((value & 0xf) != 0) {
          uVar2 = (char)(value >> 4);
        }
        *(undefined1 *)(tuple + 0x10 + slotIndex) = uVar2;
        return;
      }
      goto LAB_00143c6f;
    }
    if (bVar4 || bVar3) goto LAB_00143c3b;
    uVar1 = (ulong)(*(uint *)(tuple + 0xc) >> 3);
  }
  if (slotIndex < uVar1) {
    *(sysbvm_tuple_t *)(tuple + 0x10 + slotIndex * 8) = value;
    return;
  }
LAB_00143c6f:
  sysbvm_error_outOfBoundsSlotAccess();
  return;
}

Assistant:

SYSBVM_API void sysbvm_tuple_slotAtPut(sysbvm_context_t *context, sysbvm_tuple_t tuple, size_t slotIndex, sysbvm_tuple_t value)
{
    (void)context;
    if(!sysbvm_tuple_isNonNullPointer(tuple)) sysbvm_error_modifyImmediateValue();
    if(sysbvm_tuple_isDummyValue(tuple)) sysbvm_error_accessDummyValue();
    if(sysbvm_tuple_isImmediate(tuple)) sysbvm_error_modifyImmutableTuple();

    if(sysbvm_tuple_isBytes(tuple))
    {
        if(slotIndex < sysbvm_tuple_getSizeInBytes(tuple))
            SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->bytes[slotIndex] = sysbvm_tuple_anySize_decode(value) & 0xFF;
        else
            sysbvm_error_outOfBoundsSlotAccess();
    }
    else
    {
        if(slotIndex < sysbvm_tuple_getSizeInSlots(tuple))
            SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->pointers[slotIndex] = value;
        else
            sysbvm_error_outOfBoundsSlotAccess();
    }
}